

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void Abc_NtkDumpOneCexSpecial(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  long *plVar1;
  Aig_Man_t *p;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Abc_Cex_t *pCare;
  Abc_Cex_t *local_38;
  
  local_38 = (Abc_Cex_t *)0x0;
  p = Abc_NtkToDar(pNtk,0,1);
  local_38 = Bmc_CexCareMinimize(p,p->nTruePis,pCex,4,0,0);
  Aig_ManStop(p);
  if (local_38 == (Abc_Cex_t *)0x0) {
    puts("Counter-example minimization has failed.");
    return;
  }
  pVVar3 = pNtk->vBoxes;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar6];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pcVar2 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[6] * 8));
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
        }
        fprintf((FILE *)pFile,"CEX: %s@0=%c\n",pcVar2,(ulong)(plVar1[7] == 1 ^ 0x31));
      }
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vBoxes;
    } while (lVar6 < pVVar3->nSize);
  }
  if (-1 < pCex->iFrame) {
    uVar7 = 0;
    do {
      pVVar3 = pNtk->vPis;
      iVar5 = (int)uVar7;
      if (0 < pVVar3->nSize) {
        lVar6 = 0;
        do {
          if ((local_38 == (Abc_Cex_t *)0x0) ||
             (uVar4 = local_38->nPis * iVar5 + local_38->nRegs + (int)lVar6,
             ((uint)(&local_38[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0)) {
            pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar3->pArray[lVar6]);
            uVar4 = pCex->nPis * iVar5 + pCex->nRegs + (int)lVar6;
            fprintf((FILE *)pFile,"CEX: %s@%d=%c\n",pcVar2,uVar7,
                    (ulong)((((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) +
                           0x30));
          }
          lVar6 = lVar6 + 1;
          pVVar3 = pNtk->vPis;
        } while (lVar6 < pVVar3->nSize);
      }
      uVar7 = (ulong)(iVar5 + 1);
    } while (iVar5 < pCex->iFrame);
  }
  Abc_CexFreeP(&local_38);
  return;
}

Assistant:

void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pCare = NULL; int i, f; Abc_Obj_t * pObj;
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
    //fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
    //fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
    pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, 0, 0 );
    Aig_ManStop( pAig );
    if( pCare == NULL )   
    {
        printf( "Counter-example minimization has failed.\n" ); 
        return;
    }
    // output flop values (unaffected by the minimization)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "CEX: %s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
    // output PI values (while skipping the minimized ones)
    for ( f = 0; f <= pCex->iFrame; f++ )
        Abc_NtkForEachPi( pNtk, pObj, i )
            if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                fprintf( pFile, "CEX: %s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
    Abc_CexFreeP( &pCare );
}